

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O0

void ncnn::convdw3x3s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  undefined8 *puVar36;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r20_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r10_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _r00_2;
  __m128 _sum0_2;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _r23_1;
  __m128 _r13_1;
  __m128 _r03_1;
  __m128 _sum1_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  __m128 _r28;
  __m128 _r18;
  __m128 _r08;
  __m128 _r27;
  __m128 _r17;
  __m128 _r07;
  __m128 _sum3;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum2;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _r23;
  __m128 _r13;
  __m128 _r03;
  __m128 _sum1;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  int local_1e10;
  int local_1e0c;
  undefined8 *local_1d78;
  undefined8 *local_1d70;
  undefined8 *local_1d68;
  undefined8 *local_1d18;
  int local_1c9c;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float local_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float local_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float local_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float local_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float local_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar33 = in_RSI[6];
  lVar34 = in_RDI[7];
  iVar35 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 4;
  lVar2 = *in_RCX;
  for (local_1c9c = 0; local_1c9c < (int)lVar34; local_1c9c = local_1c9c + 1) {
    local_1d18 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_1c9c * in_RSI[2]);
    if (lVar2 == 0) {
      local_21f8 = 0;
      uStack_21f0 = 0;
    }
    else {
      puVar36 = (undefined8 *)(lVar2 + (long)(local_1c9c << 2) * 4);
      local_21f8 = *puVar36;
      uStack_21f0 = puVar36[1];
    }
    puVar36 = (undefined8 *)
              (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_1c9c * in_RDX[2]);
    local_1d68 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_1c9c * in_RDI[2]);
    local_1d70 = (undefined8 *)((long)local_1d68 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_1d78 = (undefined8 *)
                 ((long)local_1d68 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    uVar5 = *puVar36;
    uVar6 = puVar36[1];
    uVar7 = puVar36[2];
    uVar8 = puVar36[3];
    uVar9 = puVar36[4];
    uVar10 = puVar36[5];
    uVar11 = puVar36[6];
    uVar12 = puVar36[7];
    uVar13 = puVar36[8];
    uVar14 = puVar36[9];
    uVar15 = puVar36[10];
    uVar16 = puVar36[0xb];
    uVar17 = puVar36[0xc];
    uVar18 = puVar36[0xd];
    uVar19 = puVar36[0xe];
    uVar20 = puVar36[0xf];
    uVar3 = puVar36[0x10];
    uVar4 = puVar36[0x11];
    for (local_1e0c = 0; local_1e0c < (int)lVar33; local_1e0c = local_1e0c + 1) {
      local_1e10 = 0;
      while( true ) {
        local_e8 = (float)uVar5;
        fStack_e4 = (float)((ulong)uVar5 >> 0x20);
        fStack_e0 = (float)uVar6;
        fStack_dc = (float)((ulong)uVar6 >> 0x20);
        local_118 = (float)local_21f8;
        fStack_114 = (float)((ulong)local_21f8 >> 0x20);
        fStack_110 = (float)uStack_21f0;
        fStack_10c = (float)((ulong)uStack_21f0 >> 0x20);
        local_148 = (float)uVar7;
        fStack_144 = (float)((ulong)uVar7 >> 0x20);
        fStack_140 = (float)uVar8;
        fStack_13c = (float)((ulong)uVar8 >> 0x20);
        local_1a8 = (float)uVar9;
        fStack_1a4 = (float)((ulong)uVar9 >> 0x20);
        fStack_1a0 = (float)uVar10;
        fStack_19c = (float)((ulong)uVar10 >> 0x20);
        local_208 = (float)uVar11;
        fStack_204 = (float)((ulong)uVar11 >> 0x20);
        fStack_200 = (float)uVar12;
        fStack_1fc = (float)((ulong)uVar12 >> 0x20);
        local_268 = (float)uVar13;
        fStack_264 = (float)((ulong)uVar13 >> 0x20);
        fStack_260 = (float)uVar14;
        fStack_25c = (float)((ulong)uVar14 >> 0x20);
        local_2c8 = (float)uVar15;
        fStack_2c4 = (float)((ulong)uVar15 >> 0x20);
        fStack_2c0 = (float)uVar16;
        fStack_2bc = (float)((ulong)uVar16 >> 0x20);
        local_328 = (float)uVar17;
        fStack_324 = (float)((ulong)uVar17 >> 0x20);
        fStack_320 = (float)uVar18;
        fStack_31c = (float)((ulong)uVar18 >> 0x20);
        local_388 = (float)uVar19;
        fStack_384 = (float)((ulong)uVar19 >> 0x20);
        fStack_380 = (float)uVar20;
        fStack_37c = (float)((ulong)uVar20 >> 0x20);
        local_3e8 = (float)uVar3;
        fStack_3e4 = (float)((ulong)uVar3 >> 0x20);
        fStack_3e0 = (float)uVar4;
        fStack_3dc = (float)((ulong)uVar4 >> 0x20);
        if (iVar1 <= local_1e10 + 3) break;
        local_f8 = (float)*local_1d68;
        fStack_f4 = (float)((ulong)*local_1d68 >> 0x20);
        fStack_f0 = (float)local_1d68[1];
        fStack_ec = (float)((ulong)local_1d68[1] >> 0x20);
        local_158 = (float)local_1d68[2];
        fStack_154 = (float)((ulong)local_1d68[2] >> 0x20);
        fStack_150 = (float)local_1d68[3];
        fStack_14c = (float)((ulong)local_1d68[3] >> 0x20);
        local_1b8 = (float)local_1d68[4];
        fStack_1b4 = (float)((ulong)local_1d68[4] >> 0x20);
        fStack_1b0 = (float)local_1d68[5];
        fStack_1ac = (float)((ulong)local_1d68[5] >> 0x20);
        local_218 = (float)*local_1d70;
        fStack_214 = (float)((ulong)*local_1d70 >> 0x20);
        fStack_210 = (float)local_1d70[1];
        fStack_20c = (float)((ulong)local_1d70[1] >> 0x20);
        local_278 = (float)local_1d70[2];
        fStack_274 = (float)((ulong)local_1d70[2] >> 0x20);
        fStack_270 = (float)local_1d70[3];
        fStack_26c = (float)((ulong)local_1d70[3] >> 0x20);
        local_2d8 = (float)local_1d70[4];
        fStack_2d4 = (float)((ulong)local_1d70[4] >> 0x20);
        fStack_2d0 = (float)local_1d70[5];
        fStack_2cc = (float)((ulong)local_1d70[5] >> 0x20);
        local_338 = (float)*local_1d78;
        fStack_334 = (float)((ulong)*local_1d78 >> 0x20);
        fStack_330 = (float)local_1d78[1];
        fStack_32c = (float)((ulong)local_1d78[1] >> 0x20);
        local_398 = (float)local_1d78[2];
        fStack_394 = (float)((ulong)local_1d78[2] >> 0x20);
        fStack_390 = (float)local_1d78[3];
        fStack_38c = (float)((ulong)local_1d78[3] >> 0x20);
        local_3f8 = (float)local_1d78[4];
        fStack_3f4 = (float)((ulong)local_1d78[4] >> 0x20);
        fStack_3f0 = (float)local_1d78[5];
        fStack_3ec = (float)((ulong)local_1d78[5] >> 0x20);
        uVar21 = local_1d68[6];
        uVar22 = local_1d68[7];
        uVar23 = local_1d70[6];
        uVar24 = local_1d70[7];
        uVar25 = local_1d78[6];
        uVar26 = local_1d78[7];
        uVar27 = local_1d68[8];
        uVar28 = local_1d68[9];
        uVar29 = local_1d70[8];
        uVar30 = local_1d70[9];
        uVar31 = local_1d78[8];
        uVar32 = local_1d78[9];
        *local_1d18 = CONCAT44(fStack_3e4 * fStack_3f4 +
                               fStack_384 * fStack_394 +
                               fStack_324 * fStack_334 +
                               fStack_2c4 * fStack_2d4 +
                               fStack_264 * fStack_274 +
                               fStack_204 * fStack_214 +
                               fStack_1a4 * fStack_1b4 +
                               fStack_144 * fStack_154 + fStack_e4 * fStack_f4 + fStack_114,
                               local_3e8 * local_3f8 +
                               local_388 * local_398 +
                               local_328 * local_338 +
                               local_2c8 * local_2d8 +
                               local_268 * local_278 +
                               local_208 * local_218 +
                               local_1a8 * local_1b8 +
                               local_148 * local_158 + local_e8 * local_f8 + local_118);
        local_1d18[1] =
             CONCAT44(fStack_3dc * fStack_3ec +
                      fStack_37c * fStack_38c +
                      fStack_31c * fStack_32c +
                      fStack_2bc * fStack_2cc +
                      fStack_25c * fStack_26c +
                      fStack_1fc * fStack_20c +
                      fStack_19c * fStack_1ac +
                      fStack_13c * fStack_14c + fStack_dc * fStack_ec + fStack_10c,
                      fStack_3e0 * fStack_3f0 +
                      fStack_380 * fStack_390 +
                      fStack_320 * fStack_330 +
                      fStack_2c0 * fStack_2d0 +
                      fStack_260 * fStack_270 +
                      fStack_200 * fStack_210 +
                      fStack_1a0 * fStack_1b0 +
                      fStack_140 * fStack_150 + fStack_e0 * fStack_f0 + fStack_110);
        local_4b8 = (float)uVar21;
        fStack_4b4 = (float)((ulong)uVar21 >> 0x20);
        fStack_4b0 = (float)uVar22;
        fStack_4ac = (float)((ulong)uVar22 >> 0x20);
        local_518 = (float)uVar27;
        fStack_514 = (float)((ulong)uVar27 >> 0x20);
        fStack_510 = (float)uVar28;
        fStack_50c = (float)((ulong)uVar28 >> 0x20);
        local_5d8 = (float)uVar23;
        fStack_5d4 = (float)((ulong)uVar23 >> 0x20);
        fStack_5d0 = (float)uVar24;
        fStack_5cc = (float)((ulong)uVar24 >> 0x20);
        local_638 = (float)uVar29;
        fStack_634 = (float)((ulong)uVar29 >> 0x20);
        fStack_630 = (float)uVar30;
        fStack_62c = (float)((ulong)uVar30 >> 0x20);
        local_6f8 = (float)uVar25;
        fStack_6f4 = (float)((ulong)uVar25 >> 0x20);
        fStack_6f0 = (float)uVar26;
        fStack_6ec = (float)((ulong)uVar26 >> 0x20);
        local_758 = (float)uVar31;
        fStack_754 = (float)((ulong)uVar31 >> 0x20);
        fStack_750 = (float)uVar32;
        fStack_74c = (float)((ulong)uVar32 >> 0x20);
        uVar21 = local_1d68[10];
        uVar22 = local_1d68[0xb];
        uVar23 = local_1d70[10];
        uVar24 = local_1d70[0xb];
        uVar25 = local_1d78[10];
        uVar26 = local_1d78[0xb];
        uVar27 = local_1d68[0xc];
        uVar28 = local_1d68[0xd];
        uVar29 = local_1d70[0xc];
        uVar30 = local_1d70[0xd];
        uVar31 = local_1d78[0xc];
        uVar32 = local_1d78[0xd];
        local_1d18[2] =
             CONCAT44(fStack_3e4 * fStack_754 +
                      fStack_384 * fStack_6f4 +
                      fStack_324 * fStack_3f4 +
                      fStack_2c4 * fStack_634 +
                      fStack_264 * fStack_5d4 +
                      fStack_204 * fStack_2d4 +
                      fStack_1a4 * fStack_514 +
                      fStack_144 * fStack_4b4 + fStack_e4 * fStack_1b4 + fStack_114,
                      local_3e8 * local_758 +
                      local_388 * local_6f8 +
                      local_328 * local_3f8 +
                      local_2c8 * local_638 +
                      local_268 * local_5d8 +
                      local_208 * local_2d8 +
                      local_1a8 * local_518 +
                      local_148 * local_4b8 + local_e8 * local_1b8 + local_118);
        local_1d18[3] =
             CONCAT44(fStack_3dc * fStack_74c +
                      fStack_37c * fStack_6ec +
                      fStack_31c * fStack_3ec +
                      fStack_2bc * fStack_62c +
                      fStack_25c * fStack_5cc +
                      fStack_1fc * fStack_2cc +
                      fStack_19c * fStack_50c +
                      fStack_13c * fStack_4ac + fStack_dc * fStack_1ac + fStack_10c,
                      fStack_3e0 * fStack_750 +
                      fStack_380 * fStack_6f0 +
                      fStack_320 * fStack_3f0 +
                      fStack_2c0 * fStack_630 +
                      fStack_260 * fStack_5d0 +
                      fStack_200 * fStack_2d0 +
                      fStack_1a0 * fStack_510 +
                      fStack_140 * fStack_4b0 + fStack_e0 * fStack_1b0 + fStack_110);
        local_818 = (float)uVar21;
        fStack_814 = (float)((ulong)uVar21 >> 0x20);
        fStack_810 = (float)uVar22;
        fStack_80c = (float)((ulong)uVar22 >> 0x20);
        local_878 = (float)uVar27;
        fStack_874 = (float)((ulong)uVar27 >> 0x20);
        fStack_870 = (float)uVar28;
        fStack_86c = (float)((ulong)uVar28 >> 0x20);
        local_938 = (float)uVar23;
        fStack_934 = (float)((ulong)uVar23 >> 0x20);
        fStack_930 = (float)uVar24;
        fStack_92c = (float)((ulong)uVar24 >> 0x20);
        local_998 = (float)uVar29;
        fStack_994 = (float)((ulong)uVar29 >> 0x20);
        fStack_990 = (float)uVar30;
        fStack_98c = (float)((ulong)uVar30 >> 0x20);
        local_a58 = (float)uVar25;
        fStack_a54 = (float)((ulong)uVar25 >> 0x20);
        fStack_a50 = (float)uVar26;
        fStack_a4c = (float)((ulong)uVar26 >> 0x20);
        local_ab8 = (float)uVar31;
        fStack_ab4 = (float)((ulong)uVar31 >> 0x20);
        fStack_ab0 = (float)uVar32;
        fStack_aac = (float)((ulong)uVar32 >> 0x20);
        uVar21 = local_1d68[0xe];
        uVar22 = local_1d68[0xf];
        uVar23 = local_1d70[0xe];
        uVar24 = local_1d70[0xf];
        uVar25 = local_1d78[0xe];
        uVar26 = local_1d78[0xf];
        uVar27 = local_1d68[0x10];
        uVar28 = local_1d68[0x11];
        uVar29 = local_1d70[0x10];
        uVar30 = local_1d70[0x11];
        uVar31 = local_1d78[0x10];
        uVar32 = local_1d78[0x11];
        local_1d18[4] =
             CONCAT44(fStack_3e4 * fStack_ab4 +
                      fStack_384 * fStack_a54 +
                      fStack_324 * fStack_754 +
                      fStack_2c4 * fStack_994 +
                      fStack_264 * fStack_934 +
                      fStack_204 * fStack_634 +
                      fStack_1a4 * fStack_874 +
                      fStack_144 * fStack_814 + fStack_e4 * fStack_514 + fStack_114,
                      local_3e8 * local_ab8 +
                      local_388 * local_a58 +
                      local_328 * local_758 +
                      local_2c8 * local_998 +
                      local_268 * local_938 +
                      local_208 * local_638 +
                      local_1a8 * local_878 +
                      local_148 * local_818 + local_e8 * local_518 + local_118);
        local_1d18[5] =
             CONCAT44(fStack_3dc * fStack_aac +
                      fStack_37c * fStack_a4c +
                      fStack_31c * fStack_74c +
                      fStack_2bc * fStack_98c +
                      fStack_25c * fStack_92c +
                      fStack_1fc * fStack_62c +
                      fStack_19c * fStack_86c +
                      fStack_13c * fStack_80c + fStack_dc * fStack_50c + fStack_10c,
                      fStack_3e0 * fStack_ab0 +
                      fStack_380 * fStack_a50 +
                      fStack_320 * fStack_750 +
                      fStack_2c0 * fStack_990 +
                      fStack_260 * fStack_930 +
                      fStack_200 * fStack_630 +
                      fStack_1a0 * fStack_870 +
                      fStack_140 * fStack_810 + fStack_e0 * fStack_510 + fStack_110);
        local_b78 = (float)uVar21;
        fStack_b74 = (float)((ulong)uVar21 >> 0x20);
        fStack_b70 = (float)uVar22;
        fStack_b6c = (float)((ulong)uVar22 >> 0x20);
        local_bd8 = (float)uVar27;
        fStack_bd4 = (float)((ulong)uVar27 >> 0x20);
        fStack_bd0 = (float)uVar28;
        fStack_bcc = (float)((ulong)uVar28 >> 0x20);
        local_c98 = (float)uVar23;
        fStack_c94 = (float)((ulong)uVar23 >> 0x20);
        fStack_c90 = (float)uVar24;
        fStack_c8c = (float)((ulong)uVar24 >> 0x20);
        local_cf8 = (float)uVar29;
        fStack_cf4 = (float)((ulong)uVar29 >> 0x20);
        fStack_cf0 = (float)uVar30;
        fStack_cec = (float)((ulong)uVar30 >> 0x20);
        local_db8 = (float)uVar25;
        fStack_db4 = (float)((ulong)uVar25 >> 0x20);
        fStack_db0 = (float)uVar26;
        fStack_dac = (float)((ulong)uVar26 >> 0x20);
        local_e18 = (float)uVar31;
        fStack_e14 = (float)((ulong)uVar31 >> 0x20);
        fStack_e10 = (float)uVar32;
        fStack_e0c = (float)((ulong)uVar32 >> 0x20);
        local_1d18[6] =
             CONCAT44(fStack_3e4 * fStack_e14 +
                      fStack_384 * fStack_db4 +
                      fStack_324 * fStack_ab4 +
                      fStack_2c4 * fStack_cf4 +
                      fStack_264 * fStack_c94 +
                      fStack_204 * fStack_994 +
                      fStack_1a4 * fStack_bd4 +
                      fStack_144 * fStack_b74 + fStack_e4 * fStack_874 + fStack_114,
                      local_3e8 * local_e18 +
                      local_388 * local_db8 +
                      local_328 * local_ab8 +
                      local_2c8 * local_cf8 +
                      local_268 * local_c98 +
                      local_208 * local_998 +
                      local_1a8 * local_bd8 +
                      local_148 * local_b78 + local_e8 * local_878 + local_118);
        local_1d18[7] =
             CONCAT44(fStack_3dc * fStack_e0c +
                      fStack_37c * fStack_dac +
                      fStack_31c * fStack_aac +
                      fStack_2bc * fStack_cec +
                      fStack_25c * fStack_c8c +
                      fStack_1fc * fStack_98c +
                      fStack_19c * fStack_bcc +
                      fStack_13c * fStack_b6c + fStack_dc * fStack_86c + fStack_10c,
                      fStack_3e0 * fStack_e10 +
                      fStack_380 * fStack_db0 +
                      fStack_320 * fStack_ab0 +
                      fStack_2c0 * fStack_cf0 +
                      fStack_260 * fStack_c90 +
                      fStack_200 * fStack_990 +
                      fStack_1a0 * fStack_bd0 +
                      fStack_140 * fStack_b70 + fStack_e0 * fStack_870 + fStack_110);
        local_1d68 = local_1d68 + 0x10;
        local_1d70 = local_1d70 + 0x10;
        local_1d78 = local_1d78 + 0x10;
        local_1d18 = local_1d18 + 8;
        local_1e10 = local_1e10 + 4;
      }
      for (; local_1e10 + 1 < iVar1; local_1e10 = local_1e10 + 2) {
        local_e78 = (float)*local_1d68;
        fStack_e74 = (float)((ulong)*local_1d68 >> 0x20);
        fStack_e70 = (float)local_1d68[1];
        fStack_e6c = (float)((ulong)local_1d68[1] >> 0x20);
        local_ed8 = (float)local_1d68[2];
        fStack_ed4 = (float)((ulong)local_1d68[2] >> 0x20);
        fStack_ed0 = (float)local_1d68[3];
        fStack_ecc = (float)((ulong)local_1d68[3] >> 0x20);
        local_f38 = (float)local_1d68[4];
        fStack_f34 = (float)((ulong)local_1d68[4] >> 0x20);
        fStack_f30 = (float)local_1d68[5];
        fStack_f2c = (float)((ulong)local_1d68[5] >> 0x20);
        local_f98 = (float)*local_1d70;
        fStack_f94 = (float)((ulong)*local_1d70 >> 0x20);
        fStack_f90 = (float)local_1d70[1];
        fStack_f8c = (float)((ulong)local_1d70[1] >> 0x20);
        local_ff8 = (float)local_1d70[2];
        fStack_ff4 = (float)((ulong)local_1d70[2] >> 0x20);
        fStack_ff0 = (float)local_1d70[3];
        fStack_fec = (float)((ulong)local_1d70[3] >> 0x20);
        local_1058 = (float)local_1d70[4];
        fStack_1054 = (float)((ulong)local_1d70[4] >> 0x20);
        fStack_1050 = (float)local_1d70[5];
        fStack_104c = (float)((ulong)local_1d70[5] >> 0x20);
        local_10b8 = (float)*local_1d78;
        fStack_10b4 = (float)((ulong)*local_1d78 >> 0x20);
        fStack_10b0 = (float)local_1d78[1];
        fStack_10ac = (float)((ulong)local_1d78[1] >> 0x20);
        local_1118 = (float)local_1d78[2];
        fStack_1114 = (float)((ulong)local_1d78[2] >> 0x20);
        fStack_1110 = (float)local_1d78[3];
        fStack_110c = (float)((ulong)local_1d78[3] >> 0x20);
        local_1178 = (float)local_1d78[4];
        fStack_1174 = (float)((ulong)local_1d78[4] >> 0x20);
        fStack_1170 = (float)local_1d78[5];
        fStack_116c = (float)((ulong)local_1d78[5] >> 0x20);
        uVar21 = local_1d68[6];
        uVar22 = local_1d68[7];
        uVar23 = local_1d70[6];
        uVar24 = local_1d70[7];
        uVar25 = local_1d78[6];
        uVar26 = local_1d78[7];
        uVar27 = local_1d68[8];
        uVar28 = local_1d68[9];
        uVar29 = local_1d70[8];
        uVar30 = local_1d70[9];
        uVar31 = local_1d78[8];
        uVar32 = local_1d78[9];
        *local_1d18 = CONCAT44(fStack_3e4 * fStack_1174 +
                               fStack_384 * fStack_1114 +
                               fStack_324 * fStack_10b4 +
                               fStack_2c4 * fStack_1054 +
                               fStack_264 * fStack_ff4 +
                               fStack_204 * fStack_f94 +
                               fStack_1a4 * fStack_f34 +
                               fStack_144 * fStack_ed4 + fStack_e4 * fStack_e74 + fStack_114,
                               local_3e8 * local_1178 +
                               local_388 * local_1118 +
                               local_328 * local_10b8 +
                               local_2c8 * local_1058 +
                               local_268 * local_ff8 +
                               local_208 * local_f98 +
                               local_1a8 * local_f38 +
                               local_148 * local_ed8 + local_e8 * local_e78 + local_118);
        local_1d18[1] =
             CONCAT44(fStack_3dc * fStack_116c +
                      fStack_37c * fStack_110c +
                      fStack_31c * fStack_10ac +
                      fStack_2bc * fStack_104c +
                      fStack_25c * fStack_fec +
                      fStack_1fc * fStack_f8c +
                      fStack_19c * fStack_f2c +
                      fStack_13c * fStack_ecc + fStack_dc * fStack_e6c + fStack_10c,
                      fStack_3e0 * fStack_1170 +
                      fStack_380 * fStack_1110 +
                      fStack_320 * fStack_10b0 +
                      fStack_2c0 * fStack_1050 +
                      fStack_260 * fStack_ff0 +
                      fStack_200 * fStack_f90 +
                      fStack_1a0 * fStack_f30 +
                      fStack_140 * fStack_ed0 + fStack_e0 * fStack_e70 + fStack_110);
        local_1238 = (float)uVar21;
        fStack_1234 = (float)((ulong)uVar21 >> 0x20);
        fStack_1230 = (float)uVar22;
        fStack_122c = (float)((ulong)uVar22 >> 0x20);
        local_1298 = (float)uVar27;
        fStack_1294 = (float)((ulong)uVar27 >> 0x20);
        fStack_1290 = (float)uVar28;
        fStack_128c = (float)((ulong)uVar28 >> 0x20);
        local_1358 = (float)uVar23;
        fStack_1354 = (float)((ulong)uVar23 >> 0x20);
        fStack_1350 = (float)uVar24;
        fStack_134c = (float)((ulong)uVar24 >> 0x20);
        local_13b8 = (float)uVar29;
        fStack_13b4 = (float)((ulong)uVar29 >> 0x20);
        fStack_13b0 = (float)uVar30;
        fStack_13ac = (float)((ulong)uVar30 >> 0x20);
        local_1478 = (float)uVar25;
        fStack_1474 = (float)((ulong)uVar25 >> 0x20);
        fStack_1470 = (float)uVar26;
        fStack_146c = (float)((ulong)uVar26 >> 0x20);
        local_14d8 = (float)uVar31;
        fStack_14d4 = (float)((ulong)uVar31 >> 0x20);
        fStack_14d0 = (float)uVar32;
        fStack_14cc = (float)((ulong)uVar32 >> 0x20);
        local_1d18[2] =
             CONCAT44(fStack_3e4 * fStack_14d4 +
                      fStack_384 * fStack_1474 +
                      fStack_324 * fStack_1174 +
                      fStack_2c4 * fStack_13b4 +
                      fStack_264 * fStack_1354 +
                      fStack_204 * fStack_1054 +
                      fStack_1a4 * fStack_1294 +
                      fStack_144 * fStack_1234 + fStack_e4 * fStack_f34 + fStack_114,
                      local_3e8 * local_14d8 +
                      local_388 * local_1478 +
                      local_328 * local_1178 +
                      local_2c8 * local_13b8 +
                      local_268 * local_1358 +
                      local_208 * local_1058 +
                      local_1a8 * local_1298 +
                      local_148 * local_1238 + local_e8 * local_f38 + local_118);
        local_1d18[3] =
             CONCAT44(fStack_3dc * fStack_14cc +
                      fStack_37c * fStack_146c +
                      fStack_31c * fStack_116c +
                      fStack_2bc * fStack_13ac +
                      fStack_25c * fStack_134c +
                      fStack_1fc * fStack_104c +
                      fStack_19c * fStack_128c +
                      fStack_13c * fStack_122c + fStack_dc * fStack_f2c + fStack_10c,
                      fStack_3e0 * fStack_14d0 +
                      fStack_380 * fStack_1470 +
                      fStack_320 * fStack_1170 +
                      fStack_2c0 * fStack_13b0 +
                      fStack_260 * fStack_1350 +
                      fStack_200 * fStack_1050 +
                      fStack_1a0 * fStack_1290 +
                      fStack_140 * fStack_1230 + fStack_e0 * fStack_f30 + fStack_110);
        local_1d68 = local_1d68 + 8;
        local_1d70 = local_1d70 + 8;
        local_1d78 = local_1d78 + 8;
        local_1d18 = local_1d18 + 4;
      }
      for (; local_1e10 < iVar1; local_1e10 = local_1e10 + 1) {
        local_1538 = (float)*local_1d68;
        fStack_1534 = (float)((ulong)*local_1d68 >> 0x20);
        fStack_1530 = (float)local_1d68[1];
        fStack_152c = (float)((ulong)local_1d68[1] >> 0x20);
        local_1598 = (float)local_1d68[2];
        fStack_1594 = (float)((ulong)local_1d68[2] >> 0x20);
        fStack_1590 = (float)local_1d68[3];
        fStack_158c = (float)((ulong)local_1d68[3] >> 0x20);
        local_15f8 = (float)local_1d68[4];
        fStack_15f4 = (float)((ulong)local_1d68[4] >> 0x20);
        fStack_15f0 = (float)local_1d68[5];
        fStack_15ec = (float)((ulong)local_1d68[5] >> 0x20);
        local_1658 = (float)*local_1d70;
        fStack_1654 = (float)((ulong)*local_1d70 >> 0x20);
        fStack_1650 = (float)local_1d70[1];
        fStack_164c = (float)((ulong)local_1d70[1] >> 0x20);
        local_16b8 = (float)local_1d70[2];
        fStack_16b4 = (float)((ulong)local_1d70[2] >> 0x20);
        fStack_16b0 = (float)local_1d70[3];
        fStack_16ac = (float)((ulong)local_1d70[3] >> 0x20);
        local_1718 = (float)local_1d70[4];
        fStack_1714 = (float)((ulong)local_1d70[4] >> 0x20);
        fStack_1710 = (float)local_1d70[5];
        fStack_170c = (float)((ulong)local_1d70[5] >> 0x20);
        local_1778 = (float)*local_1d78;
        fStack_1774 = (float)((ulong)*local_1d78 >> 0x20);
        fStack_1770 = (float)local_1d78[1];
        fStack_176c = (float)((ulong)local_1d78[1] >> 0x20);
        local_17d8 = (float)local_1d78[2];
        fStack_17d4 = (float)((ulong)local_1d78[2] >> 0x20);
        fStack_17d0 = (float)local_1d78[3];
        fStack_17cc = (float)((ulong)local_1d78[3] >> 0x20);
        local_1838 = (float)local_1d78[4];
        fStack_1834 = (float)((ulong)local_1d78[4] >> 0x20);
        fStack_1830 = (float)local_1d78[5];
        fStack_182c = (float)((ulong)local_1d78[5] >> 0x20);
        *local_1d18 = CONCAT44(fStack_3e4 * fStack_1834 +
                               fStack_384 * fStack_17d4 +
                               fStack_324 * fStack_1774 +
                               fStack_2c4 * fStack_1714 +
                               fStack_264 * fStack_16b4 +
                               fStack_204 * fStack_1654 +
                               fStack_1a4 * fStack_15f4 +
                               fStack_144 * fStack_1594 + fStack_e4 * fStack_1534 + fStack_114,
                               local_3e8 * local_1838 +
                               local_388 * local_17d8 +
                               local_328 * local_1778 +
                               local_2c8 * local_1718 +
                               local_268 * local_16b8 +
                               local_208 * local_1658 +
                               local_1a8 * local_15f8 +
                               local_148 * local_1598 + local_e8 * local_1538 + local_118);
        local_1d18[1] =
             CONCAT44(fStack_3dc * fStack_182c +
                      fStack_37c * fStack_17cc +
                      fStack_31c * fStack_176c +
                      fStack_2bc * fStack_170c +
                      fStack_25c * fStack_16ac +
                      fStack_1fc * fStack_164c +
                      fStack_19c * fStack_15ec +
                      fStack_13c * fStack_158c + fStack_dc * fStack_152c + fStack_10c,
                      fStack_3e0 * fStack_1830 +
                      fStack_380 * fStack_17d0 +
                      fStack_320 * fStack_1770 +
                      fStack_2c0 * fStack_1710 +
                      fStack_260 * fStack_16b0 +
                      fStack_200 * fStack_1650 +
                      fStack_1a0 * fStack_15f0 +
                      fStack_140 * fStack_1590 + fStack_e0 * fStack_1530 + fStack_110);
        local_1d68 = local_1d68 + 4;
        local_1d70 = local_1d70 + 4;
        local_1d78 = local_1d78 + 4;
        local_1d18 = local_1d18 + 2;
      }
      local_1d68 = (undefined8 *)((long)local_1d68 + (long)iVar35 * 4);
      local_1d70 = (undefined8 *)((long)local_1d70 + (long)iVar35 * 4);
      local_1d78 = (undefined8 *)((long)local_1d78 + (long)iVar35 * 4);
    }
  }
  return;
}

Assistant:

static void convdw3x3s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r26, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm_store_ps(outptr0, _sum0);
                r0 += 2 * 4;
                r1 += 2 * 4;
                r2 += 2 * 4;
                outptr0 += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}